

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void disas_simd_shift_imm(DisasContext_conflict1 *s,uint32_t insn)

{
  uint32_t rd_00;
  uint32_t rn_00;
  uint32_t opcode_00;
  uint32_t immb_00;
  uint32_t immh_00;
  uint32_t uVar1;
  bool is_u_00;
  bool is_q_00;
  _Bool is_q;
  _Bool is_u;
  int immh;
  int immb;
  int opcode;
  int rn;
  int rd;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  rd_00 = extract32(insn,0,5);
  rn_00 = extract32(insn,5,5);
  opcode_00 = extract32(insn,0xb,5);
  immb_00 = extract32(insn,0x10,3);
  immh_00 = extract32(insn,0x13,4);
  uVar1 = extract32(insn,0x1d,1);
  is_u_00 = uVar1 != 0;
  uVar1 = extract32(insn,0x1e,1);
  is_q_00 = uVar1 != 0;
  if (immh_00 == 0) {
    __assert_fail("immh != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x29a6,"void disas_simd_shift_imm(DisasContext *, uint32_t)");
  }
  switch(opcode_00) {
  default:
    unallocated_encoding_aarch64(s);
    break;
  case 8:
    if (!is_u_00) {
      unallocated_encoding_aarch64(s);
      return;
    }
  case 0:
  case 2:
  case 4:
  case 6:
    handle_vec_simd_shri(s,is_q_00,is_u_00,immh_00,immb_00,opcode_00,rn_00,rd_00);
    break;
  case 10:
    handle_vec_simd_shli(s,is_q_00,is_u_00,immh_00,immb_00,opcode_00,rn_00,rd_00);
    break;
  case 0xc:
    if (is_u_00) {
      handle_simd_qshl(s,false,is_q_00,false,true,immh_00,immb_00,rn_00,rd_00);
    }
    else {
      unallocated_encoding_aarch64(s);
    }
    break;
  case 0xe:
    handle_simd_qshl(s,false,is_q_00,is_u_00,is_u_00,immh_00,immb_00,rn_00,rd_00);
    break;
  case 0x10:
  case 0x11:
    if (is_u_00) {
      handle_vec_simd_sqshrn(s,false,is_q_00,false,true,immh_00,immb_00,opcode_00,rn_00,rd_00);
    }
    else {
      handle_vec_simd_shrn(s,is_q_00,immh_00,immb_00,opcode_00,rn_00,rd_00);
    }
    break;
  case 0x12:
  case 0x13:
    handle_vec_simd_sqshrn(s,false,is_q_00,is_u_00,is_u_00,immh_00,immb_00,opcode_00,rn_00,rd_00);
    break;
  case 0x14:
    handle_vec_simd_wshli(s,is_q_00,is_u_00,immh_00,immb_00,opcode_00,rn_00,rd_00);
    break;
  case 0x1c:
    handle_simd_shift_intfp_conv(s,false,is_q_00,is_u_00,immh_00,immb_00,opcode_00,rn_00,rd_00);
    break;
  case 0x1f:
    handle_simd_shift_fpint_conv(s,false,is_q_00,is_u_00,immh_00,immb_00,rn_00,rd_00);
  }
  return;
}

Assistant:

static void disas_simd_shift_imm(DisasContext *s, uint32_t insn)
{
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int opcode = extract32(insn, 11, 5);
    int immb = extract32(insn, 16, 3);
    int immh = extract32(insn, 19, 4);
    bool is_u = extract32(insn, 29, 1);
    bool is_q = extract32(insn, 30, 1);

    /* data_proc_simd[] has sent immh == 0 to disas_simd_mod_imm. */
    assert(immh != 0);

    switch (opcode) {
    case 0x08: /* SRI */
        if (!is_u) {
            unallocated_encoding(s);
            return;
        }
        /* fall through */
    case 0x00: /* SSHR / USHR */
    case 0x02: /* SSRA / USRA (accumulate) */
    case 0x04: /* SRSHR / URSHR (rounding) */
    case 0x06: /* SRSRA / URSRA (accum + rounding) */
        handle_vec_simd_shri(s, is_q, is_u, immh, immb, opcode, rn, rd);
        break;
    case 0x0a: /* SHL / SLI */
        handle_vec_simd_shli(s, is_q, is_u, immh, immb, opcode, rn, rd);
        break;
    case 0x10: /* SHRN */
    case 0x11: /* RSHRN / SQRSHRUN */
        if (is_u) {
            handle_vec_simd_sqshrn(s, false, is_q, false, true, immh, immb,
                                   opcode, rn, rd);
        } else {
            handle_vec_simd_shrn(s, is_q, immh, immb, opcode, rn, rd);
        }
        break;
    case 0x12: /* SQSHRN / UQSHRN */
    case 0x13: /* SQRSHRN / UQRSHRN */
        handle_vec_simd_sqshrn(s, false, is_q, is_u, is_u, immh, immb,
                               opcode, rn, rd);
        break;
    case 0x14: /* SSHLL / USHLL */
        handle_vec_simd_wshli(s, is_q, is_u, immh, immb, opcode, rn, rd);
        break;
    case 0x1c: /* SCVTF / UCVTF */
        handle_simd_shift_intfp_conv(s, false, is_q, is_u, immh, immb,
                                     opcode, rn, rd);
        break;
    case 0xc: /* SQSHLU */
        if (!is_u) {
            unallocated_encoding(s);
            return;
        }
        handle_simd_qshl(s, false, is_q, false, true, immh, immb, rn, rd);
        break;
    case 0xe: /* SQSHL, UQSHL */
        handle_simd_qshl(s, false, is_q, is_u, is_u, immh, immb, rn, rd);
        break;
    case 0x1f: /* FCVTZS/ FCVTZU */
        handle_simd_shift_fpint_conv(s, false, is_q, is_u, immh, immb, rn, rd);
        return;
    default:
        unallocated_encoding(s);
        return;
    }
}